

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall
LLVMBC::InsertElementInst::InsertElementInst
          (InsertElementInst *this,Value *vec,Value *value,Value *index)

{
  initializer_list<LLVMBC::Value_*> __l;
  Type *type;
  allocator_type local_69;
  Value *local_68;
  Value *local_60;
  Value *local_58;
  iterator local_50;
  undefined8 local_48;
  vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> local_40;
  Value *local_28;
  Value *index_local;
  Value *value_local;
  Value *vec_local;
  InsertElementInst *this_local;
  
  local_28 = index;
  index_local = value;
  value_local = vec;
  vec_local = (Value *)this;
  type = Value::getType(vec);
  Instruction::Instruction(&this->super_Instruction,type,InsertElement);
  local_68 = value_local;
  local_60 = index_local;
  local_58 = local_28;
  local_50 = &local_68;
  local_48 = 3;
  __l._M_len = 3;
  __l._M_array = local_50;
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::vector
            (&local_40,__l,&local_69);
  Instruction::set_operands(&this->super_Instruction,&local_40);
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::~vector(&local_40)
  ;
  return;
}

Assistant:

InsertElementInst::InsertElementInst(Value *vec, Value *value, Value *index)
	: Instruction(vec->getType(), ValueKind::InsertElement)
{
	set_operands({ vec, value, index });
}